

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractPlugin.cpp
# Opt level: O3

void __thiscall
Corrade::PluginManager::AbstractPlugin::AbstractPlugin
          (AbstractPlugin *this,AbstractManager *manager,StringView *plugin)

{
  Pointer<Corrade::PluginManager::AbstractPlugin::State> *this_00;
  StringView plugin_00;
  State *pSVar1;
  ConfigurationGroup *pCVar2;
  String local_40 [24];
  
  this->_vptr_AbstractPlugin = (_func_int **)&PTR___cxa_pure_virtual_00112d88;
  this_00 = &this->_state;
  Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::Pointer<>(this_00);
  pSVar1 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->(this_00);
  pSVar1->manager = manager;
  Corrade::Containers::String::nullTerminatedGlobalView
            (local_40,plugin->_data,plugin->_sizePlusFlags);
  pSVar1 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->(this_00);
  Corrade::Containers::String::operator=(&pSVar1->plugin,local_40);
  Corrade::Containers::String::~String(local_40);
  plugin_00 = *plugin;
  pSVar1 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->(this_00);
  AbstractManager::registerInstance(manager,plugin_00,this,&pSVar1->metadata);
  pSVar1 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->(this_00);
  pCVar2 = PluginMetadata::configuration(pSVar1->metadata);
  pSVar1 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->(this_00);
  Corrade::Utility::ConfigurationGroup::operator=(&pSVar1->configuration,pCVar2);
  return;
}

Assistant:

AbstractPlugin::AbstractPlugin(AbstractManager& manager, const Containers::StringView& plugin): _state{InPlaceInit} {
    _state->manager = &manager;
    _state->plugin = Containers::String::nullTerminatedGlobalView(plugin);
    manager.registerInstance(plugin, *this, _state->metadata);
    _state->configuration = _state->metadata->configuration();
}